

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprk.c
# Opt level: O0

ARKodeSPRKTable ARKodeSPRKTable_LoadByName(char *method)

{
  int iVar1;
  char *in_RDI;
  ARKodeSPRKTable local_8;
  
  iVar1 = strcmp(in_RDI,"ARKODE_SPRK_EULER_1_1");
  if (iVar1 == 0) {
    local_8 = arkodeSymplecticEuler();
  }
  else {
    iVar1 = strcmp(in_RDI,"ARKODE_SPRK_LEAPFROG_2_2");
    if (iVar1 == 0) {
      local_8 = arkodeSymplecticLeapfrog2();
    }
    else {
      iVar1 = strcmp(in_RDI,"ARKODE_SPRK_PSEUDO_LEAPFROG_2_2");
      if (iVar1 == 0) {
        local_8 = arkodeSymplecticPseudoLeapfrog2();
      }
      else {
        iVar1 = strcmp(in_RDI,"ARKODE_SPRK_RUTH_3_3");
        if (iVar1 == 0) {
          local_8 = arkodeSymplecticRuth3();
        }
        else {
          iVar1 = strcmp(in_RDI,"ARKODE_SPRK_MCLACHLAN_2_2");
          if (iVar1 == 0) {
            local_8 = arkodeSymplecticMcLachlan2();
          }
          else {
            iVar1 = strcmp(in_RDI,"ARKODE_SPRK_MCLACHLAN_3_3");
            if (iVar1 == 0) {
              local_8 = arkodeSymplecticMcLachlan3();
            }
            else {
              iVar1 = strcmp(in_RDI,"ARKODE_SPRK_MCLACHLAN_4_4");
              if (iVar1 == 0) {
                local_8 = arkodeSymplecticMcLachlan4();
              }
              else {
                iVar1 = strcmp(in_RDI,"ARKODE_SPRK_CANDY_ROZMUS_4_4");
                if (iVar1 == 0) {
                  local_8 = arkodeSymplecticCandyRozmus4();
                }
                else {
                  iVar1 = strcmp(in_RDI,"ARKODE_SPRK_MCLACHLAN_5_6");
                  if (iVar1 == 0) {
                    local_8 = arkodeSymplecticMcLachlan5();
                  }
                  else {
                    iVar1 = strcmp(in_RDI,"ARKODE_SPRK_YOSHIDA_6_8");
                    if (iVar1 == 0) {
                      local_8 = arkodeSymplecticYoshida6();
                    }
                    else {
                      iVar1 = strcmp(in_RDI,"ARKODE_SPRK_SUZUKI_UMENO_8_16");
                      if (iVar1 == 0) {
                        local_8 = arkodeSymplecticSuzukiUmeno816();
                      }
                      else {
                        iVar1 = strcmp(in_RDI,"ARKODE_SPRK_SOFRONIOU_10_36");
                        if (iVar1 == 0) {
                          local_8 = arkodeSymplecticSofroniou10();
                        }
                        else {
                          local_8 = (ARKodeSPRKTable)0x0;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

ARKodeSPRKTable ARKodeSPRKTable_LoadByName(const char* method)
{
  if (!strcmp(method, "ARKODE_SPRK_EULER_1_1"))
  {
    return arkodeSymplecticEuler();
  }
  if (!strcmp(method, "ARKODE_SPRK_LEAPFROG_2_2"))
  {
    return arkodeSymplecticLeapfrog2();
  }
  if (!strcmp(method, "ARKODE_SPRK_PSEUDO_LEAPFROG_2_2"))
  {
    return arkodeSymplecticPseudoLeapfrog2();
  }
  if (!strcmp(method, "ARKODE_SPRK_RUTH_3_3"))
  {
    return arkodeSymplecticRuth3();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_2_2"))
  {
    return arkodeSymplecticMcLachlan2();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_3_3"))
  {
    return arkodeSymplecticMcLachlan3();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_4_4"))
  {
    return arkodeSymplecticMcLachlan4();
  }
  if (!strcmp(method, "ARKODE_SPRK_CANDY_ROZMUS_4_4"))
  {
    return arkodeSymplecticCandyRozmus4();
  }
  if (!strcmp(method, "ARKODE_SPRK_MCLACHLAN_5_6"))
  {
    return arkodeSymplecticMcLachlan5();
  }
  if (!strcmp(method, "ARKODE_SPRK_YOSHIDA_6_8"))
  {
    return arkodeSymplecticYoshida6();
  }
  if (!strcmp(method, "ARKODE_SPRK_SUZUKI_UMENO_8_16"))
  {
    return arkodeSymplecticSuzukiUmeno816();
  }
  if (!strcmp(method, "ARKODE_SPRK_SOFRONIOU_10_36"))
  {
    return arkodeSymplecticSofroniou10();
  }
  return NULL;
}